

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O2

GetIndexDataStruct *
cfd::js::api::ElementsTransactionStructApi::GetTxOutIndex
          (GetIndexDataStruct *__return_storage_ptr__,GetTxOutIndexRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxOutIndexRequestStruct_&)>
  local_f8;
  GetIndexDataStruct local_d8;
  
  GetIndexDataStruct::GetIndexDataStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxOutIndexRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:1440:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxOutIndexRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:1440:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"GetTxOutIndex",&local_119);
  ExecuteStructApi<cfd::js::api::GetTxOutIndexRequestStruct,cfd::js::api::GetIndexDataStruct>
            (&local_d8,(api *)request,(GetTxOutIndexRequestStruct *)&local_118,&local_f8,in_R8);
  GetIndexDataStruct::operator=(__return_storage_ptr__,&local_d8);
  GetIndexDataStruct::~GetIndexDataStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

GetIndexDataStruct ElementsTransactionStructApi::GetTxOutIndex(
    const GetTxOutIndexRequestStruct& request) {
  auto call_func = [](const GetTxOutIndexRequestStruct& request)
      -> GetIndexDataStruct {  // NOLINT
    GetIndexDataStruct response;

    ConfidentialTransactionContext ctx(request.tx);
    if (!request.address.empty()) {
      ElementsAddressFactory address_factory;
      if (ElementsConfidentialAddress::IsConfidentialAddress(
              request.address)) {
        ElementsConfidentialAddress confidential_addr(request.address);
        ctx.IsFindTxOut(
            confidential_addr.GetUnblindedAddress(), &response.index,
            &response.indexes);
      } else {
        ctx.IsFindTxOut(
            address_factory.GetAddress(request.address), &response.index,
            &response.indexes);
      }
    } else {
      ctx.IsFindTxOut(
          Script(request.direct_locking_script), &response.index,
          &response.indexes);
    }
    if (response.indexes.empty()) {
      warn(CFD_LOG_SOURCE, "target is not found.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "target is not found.");
    }
    return response;
  };

  GetIndexDataStruct result;
  result = ExecuteStructApi<GetTxOutIndexRequestStruct, GetIndexDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}